

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.h
# Opt level: O0

SpanSetIter __thiscall tcmalloc::Span::ExtractSpanSetIterator(Span *this)

{
  SpanSetIter *this_iter;
  Span *this_local;
  SpanSetIter retval;
  
  *(uint *)&this->field_0x28 = *(uint *)&this->field_0x28 & 0xf7ffffff;
  return (SpanSetIter)(_Base_ptr)(this->field_4).objects;
}

Assistant:

inline SpanSetIter Span::ExtractSpanSetIterator() {
  ASSERT(has_span_iter);
  has_span_iter = 0;

  SpanSetIter* this_iter =
    reinterpret_cast<SpanSetIter*>(span_iter_space);
  SpanSetIter retval = *this_iter;
  this_iter->~SpanSetIter();
  return retval;
}